

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure::~IfcRelContainedInSpatialStructure
          (IfcRelContainedInSpatialStructure *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  void *pvVar3;
  
  p_Var2 = (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper +
           (long)p_Var2);
  *(undefined ***)
   ((long)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper +
   (long)p_Var2) = &PTR__IfcRelContainedInSpatialStructure_0082c4e0;
  *(undefined ***)(&this->field_0xd8 + (long)p_Var2) =
       &PTR__IfcRelContainedInSpatialStructure_0082c580;
  *(undefined ***)
   (&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.field_0x88 + (long)p_Var2) =
       &PTR__IfcRelContainedInSpatialStructure_0082c508;
  *(undefined ***)
   (&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.field_0x98 + (long)p_Var2) =
       &PTR__IfcRelContainedInSpatialStructure_0082c530;
  *(undefined ***)(&(this->super_IfcRelConnects).super_IfcRelationship.field_0xa8 + (long)p_Var2) =
       &PTR__IfcRelContainedInSpatialStructure_0082c558;
  pvVar3 = *(void **)(&(this->super_IfcRelConnects).field_0xb8 + (long)p_Var2);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)(p_Var1 + 200) - (long)pvVar3);
  }
  *(undefined8 *)p_Var1 = 0x82c770;
  *(undefined8 *)(p_Var1 + 0xd8) = 0x82c798;
  if (*(code **)(p_Var1 + 0x60) != p_Var1 + 0x70) {
    operator_delete(*(code **)(p_Var1 + 0x60),*(long *)(p_Var1 + 0x70) + 1);
  }
  if (*(code **)(p_Var1 + 0x38) != p_Var1 + 0x48) {
    operator_delete(*(code **)(p_Var1 + 0x38),*(long *)(p_Var1 + 0x48) + 1);
  }
  if (*(code **)(p_Var1 + 0x10) != p_Var1 + 0x20) {
    operator_delete(*(code **)(p_Var1 + 0x10),*(long *)(p_Var1 + 0x20) + 1);
  }
  operator_delete(p_Var1,0xf0);
  return;
}

Assistant:

IfcRelContainedInSpatialStructure() : Object("IfcRelContainedInSpatialStructure") {}